

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

char * spng_strerror(int err)

{
  char *pcStack_10;
  int err_local;
  
  switch(err) {
  case 0:
    pcStack_10 = "success";
    break;
  case 1:
    pcStack_10 = "invalid argument";
    break;
  case 2:
    pcStack_10 = "out of memory";
    break;
  case 3:
    pcStack_10 = "arithmetic overflow";
    break;
  case 4:
    pcStack_10 = "invalid signature";
    break;
  case 5:
    pcStack_10 = "invalid image width";
    break;
  case 6:
    pcStack_10 = "invalid image height";
    break;
  case 7:
    pcStack_10 = "image width exceeds user limit";
    break;
  case 8:
    pcStack_10 = "image height exceeds user limit";
    break;
  case 9:
    pcStack_10 = "invalid bit depth";
    break;
  case 10:
    pcStack_10 = "invalid color type";
    break;
  case 0xb:
    pcStack_10 = "invalid compression method";
    break;
  case 0xc:
    pcStack_10 = "invalid filter method";
    break;
  case 0xd:
    pcStack_10 = "invalid interlace method";
    break;
  case 0xe:
    pcStack_10 = "invalid IHDR chunk size";
    break;
  case 0xf:
    pcStack_10 = "missing IHDR chunk";
    break;
  case 0x10:
    pcStack_10 = "invalid chunk position";
    break;
  case 0x11:
    pcStack_10 = "invalid chunk length";
    break;
  case 0x12:
    pcStack_10 = "invalid chunk checksum";
    break;
  case 0x13:
    pcStack_10 = "invalid chunk type";
    break;
  case 0x14:
    pcStack_10 = "unknown critical chunk";
    break;
  case 0x15:
    pcStack_10 = "duplicate PLTE chunk";
    break;
  case 0x16:
    pcStack_10 = "duplicate cHRM chunk";
    break;
  case 0x17:
    pcStack_10 = "duplicate gAMA chunk";
    break;
  case 0x18:
    pcStack_10 = "duplicate iCCP chunk";
    break;
  case 0x19:
    pcStack_10 = "duplicate sBIT chunk";
    break;
  case 0x1a:
    pcStack_10 = "duplicate sRGB chunk";
    break;
  case 0x1b:
    pcStack_10 = "duplicate bKGD chunk";
    break;
  case 0x1c:
    pcStack_10 = "duplicate hIST chunk";
    break;
  case 0x1d:
    pcStack_10 = "duplicate tRNS chunk";
    break;
  case 0x1e:
    pcStack_10 = "duplicate pHYs chunk";
    break;
  case 0x1f:
    pcStack_10 = "duplicate tIME chunk";
    break;
  case 0x20:
    pcStack_10 = "duplicate oFFs chunk";
    break;
  case 0x21:
    pcStack_10 = "duplicate eXIf chunk";
    break;
  case 0x22:
    pcStack_10 = "invalid cHRM chunk";
    break;
  case 0x23:
    pcStack_10 = "invalid palette (PLTE) index";
    break;
  case 0x24:
    pcStack_10 = "tRNS chunk with incompatible color type";
    break;
  case 0x25:
    pcStack_10 = "missing palette (PLTE) for tRNS chunk";
    break;
  case 0x26:
    pcStack_10 = "invalid gAMA chunk";
    break;
  case 0x27:
    pcStack_10 = "invalid iCCP profile name";
    break;
  case 0x28:
    pcStack_10 = "invalid iCCP compression method";
    break;
  case 0x29:
    pcStack_10 = "invalid sBIT chunk";
    break;
  case 0x2a:
    pcStack_10 = "invalid sRGB chunk";
    break;
  case 0x2b:
    pcStack_10 = "invalid tEXt chunk";
    break;
  case 0x2c:
    pcStack_10 = "invalid tEXt keyword";
    break;
  case 0x2d:
    pcStack_10 = "invalid zTXt chunk";
    break;
  case 0x2e:
    pcStack_10 = "invalid zTXt compression method";
    break;
  case 0x2f:
    pcStack_10 = "invalid iTXt chunk";
    break;
  case 0x30:
    pcStack_10 = "invalid iTXt compression flag";
    break;
  case 0x31:
    pcStack_10 = "invalid iTXt compression method";
    break;
  case 0x32:
    pcStack_10 = "invalid iTXt language tag";
    break;
  case 0x33:
    pcStack_10 = "invalid iTXt translated key";
    break;
  case 0x34:
    pcStack_10 = "missing palette for bKGD chunk";
    break;
  case 0x35:
    pcStack_10 = "invalid palette index for bKGD chunk";
    break;
  case 0x36:
    pcStack_10 = "missing palette for hIST chunk";
    break;
  case 0x37:
    pcStack_10 = "invalid pHYs chunk";
    break;
  case 0x38:
    pcStack_10 = "invalid suggested palette name";
    break;
  case 0x39:
    pcStack_10 = "duplicate suggested palette (sPLT) name";
    break;
  case 0x3a:
    pcStack_10 = "invalid suggested palette (sPLT) sample depth";
    break;
  case 0x3b:
    pcStack_10 = "invalid tIME chunk";
    break;
  case 0x3c:
    pcStack_10 = "invalid oFFs chunk";
    break;
  case 0x3d:
    pcStack_10 = "invalid eXIf chunk";
    break;
  case 0x3e:
    pcStack_10 = "IDAT stream too short";
    break;
  case 0x3f:
    pcStack_10 = "IDAT stream error";
    break;
  case 0x40:
    pcStack_10 = "zlib error";
    break;
  case 0x41:
    pcStack_10 = "invalid scanline filter";
    break;
  case 0x42:
    pcStack_10 = "invalid buffer size";
    break;
  case 0x43:
    pcStack_10 = "i/o error";
    break;
  case 0x44:
    pcStack_10 = "end of file";
    break;
  case 0x45:
    pcStack_10 = "buffer already set";
    break;
  case 0x46:
    pcStack_10 = "non-recoverable state";
    break;
  case 0x47:
    pcStack_10 = "invalid format";
    break;
  case 0x48:
    pcStack_10 = "invalid flags";
    break;
  case 0x49:
    pcStack_10 = "chunk not available";
    break;
  case 0x4a:
    pcStack_10 = "encode only context";
    break;
  case 0x4b:
    pcStack_10 = "reached end-of-image state";
    break;
  case 0x4c:
    pcStack_10 = "missing PLTE for indexed image";
    break;
  case 0x4d:
    pcStack_10 = "reached chunk/cache limits";
    break;
  case 0x4e:
    pcStack_10 = "zlib init error";
    break;
  case 0x4f:
    pcStack_10 = "chunk exceeds maximum standard length";
    break;
  case 0x50:
    pcStack_10 = "internal error";
    break;
  case 0x51:
    pcStack_10 = "invalid operation for context type";
    break;
  case 0x52:
    pcStack_10 = "source PNG not set";
    break;
  case 0x53:
    pcStack_10 = "PNG output not set";
    break;
  case 0x54:
    pcStack_10 = "invalid operation for state";
    break;
  case 0x55:
    pcStack_10 = "PNG not finalized";
    break;
  case -2:
    pcStack_10 = "stream error";
    break;
  case -1:
    pcStack_10 = "end of stream";
    break;
  default:
    pcStack_10 = "unknown error";
  }
  return pcStack_10;
}

Assistant:

const char *spng_strerror(int err)
{
    switch(err)
    {
        case SPNG_IO_EOF: return "end of stream";
        case SPNG_IO_ERROR: return "stream error";
        case SPNG_OK: return "success";
        case SPNG_EINVAL: return "invalid argument";
        case SPNG_EMEM: return "out of memory";
        case SPNG_EOVERFLOW: return "arithmetic overflow";
        case SPNG_ESIGNATURE: return "invalid signature";
        case SPNG_EWIDTH: return "invalid image width";
        case SPNG_EHEIGHT: return "invalid image height";
        case SPNG_EUSER_WIDTH: return "image width exceeds user limit";
        case SPNG_EUSER_HEIGHT: return "image height exceeds user limit";
        case SPNG_EBIT_DEPTH: return "invalid bit depth";
        case SPNG_ECOLOR_TYPE: return "invalid color type";
        case SPNG_ECOMPRESSION_METHOD: return "invalid compression method";
        case SPNG_EFILTER_METHOD: return "invalid filter method";
        case SPNG_EINTERLACE_METHOD: return "invalid interlace method";
        case SPNG_EIHDR_SIZE: return "invalid IHDR chunk size";
        case SPNG_ENOIHDR: return "missing IHDR chunk";
        case SPNG_ECHUNK_POS: return "invalid chunk position";
        case SPNG_ECHUNK_SIZE: return "invalid chunk length";
        case SPNG_ECHUNK_CRC: return "invalid chunk checksum";
        case SPNG_ECHUNK_TYPE: return "invalid chunk type";
        case SPNG_ECHUNK_UNKNOWN_CRITICAL: return "unknown critical chunk";
        case SPNG_EDUP_PLTE: return "duplicate PLTE chunk";
        case SPNG_EDUP_CHRM: return "duplicate cHRM chunk";
        case SPNG_EDUP_GAMA: return "duplicate gAMA chunk";
        case SPNG_EDUP_ICCP: return "duplicate iCCP chunk";
        case SPNG_EDUP_SBIT: return "duplicate sBIT chunk";
        case SPNG_EDUP_SRGB: return "duplicate sRGB chunk";
        case SPNG_EDUP_BKGD: return "duplicate bKGD chunk";
        case SPNG_EDUP_HIST: return "duplicate hIST chunk";
        case SPNG_EDUP_TRNS: return "duplicate tRNS chunk";
        case SPNG_EDUP_PHYS: return "duplicate pHYs chunk";
        case SPNG_EDUP_TIME: return "duplicate tIME chunk";
        case SPNG_EDUP_OFFS: return "duplicate oFFs chunk";
        case SPNG_EDUP_EXIF: return "duplicate eXIf chunk";
        case SPNG_ECHRM: return "invalid cHRM chunk";
        case SPNG_EPLTE_IDX: return "invalid palette (PLTE) index";
        case SPNG_ETRNS_COLOR_TYPE: return "tRNS chunk with incompatible color type";
        case SPNG_ETRNS_NO_PLTE: return "missing palette (PLTE) for tRNS chunk";
        case SPNG_EGAMA: return "invalid gAMA chunk";
        case SPNG_EICCP_NAME: return "invalid iCCP profile name";
        case SPNG_EICCP_COMPRESSION_METHOD: return "invalid iCCP compression method";
        case SPNG_ESBIT: return "invalid sBIT chunk";
        case SPNG_ESRGB: return "invalid sRGB chunk";
        case SPNG_ETEXT: return "invalid tEXt chunk";
        case SPNG_ETEXT_KEYWORD: return "invalid tEXt keyword";
        case SPNG_EZTXT: return "invalid zTXt chunk";
        case SPNG_EZTXT_COMPRESSION_METHOD: return "invalid zTXt compression method";
        case SPNG_EITXT: return "invalid iTXt chunk";
        case SPNG_EITXT_COMPRESSION_FLAG: return "invalid iTXt compression flag";
        case SPNG_EITXT_COMPRESSION_METHOD: return "invalid iTXt compression method";
        case SPNG_EITXT_LANG_TAG: return "invalid iTXt language tag";
        case SPNG_EITXT_TRANSLATED_KEY: return "invalid iTXt translated key";
        case SPNG_EBKGD_NO_PLTE: return "missing palette for bKGD chunk";
        case SPNG_EBKGD_PLTE_IDX: return "invalid palette index for bKGD chunk";
        case SPNG_EHIST_NO_PLTE: return "missing palette for hIST chunk";
        case SPNG_EPHYS: return "invalid pHYs chunk";
        case SPNG_ESPLT_NAME: return "invalid suggested palette name";
        case SPNG_ESPLT_DUP_NAME: return "duplicate suggested palette (sPLT) name";
        case SPNG_ESPLT_DEPTH: return "invalid suggested palette (sPLT) sample depth";
        case SPNG_ETIME: return "invalid tIME chunk";
        case SPNG_EOFFS: return "invalid oFFs chunk";
        case SPNG_EEXIF: return "invalid eXIf chunk";
        case SPNG_EIDAT_TOO_SHORT: return "IDAT stream too short";
        case SPNG_EIDAT_STREAM: return "IDAT stream error";
        case SPNG_EZLIB: return "zlib error";
        case SPNG_EFILTER: return "invalid scanline filter";
        case SPNG_EBUFSIZ: return "invalid buffer size";
        case SPNG_EIO: return "i/o error";
        case SPNG_EOF: return "end of file";
        case SPNG_EBUF_SET: return "buffer already set";
        case SPNG_EBADSTATE: return "non-recoverable state";
        case SPNG_EFMT: return "invalid format";
        case SPNG_EFLAGS: return "invalid flags";
        case SPNG_ECHUNKAVAIL: return "chunk not available";
        case SPNG_ENCODE_ONLY: return "encode only context";
        case SPNG_EOI: return "reached end-of-image state";
        case SPNG_ENOPLTE: return "missing PLTE for indexed image";
        case SPNG_ECHUNK_LIMITS: return "reached chunk/cache limits";
        case SPNG_EZLIB_INIT: return "zlib init error";
        case SPNG_ECHUNK_STDLEN: return "chunk exceeds maximum standard length";
        case SPNG_EINTERNAL: return "internal error";
        case SPNG_ECTXTYPE: return "invalid operation for context type";
        case SPNG_ENOSRC: return "source PNG not set";
        case SPNG_ENODST: return "PNG output not set";
        case SPNG_EOPSTATE: return "invalid operation for state";
        case SPNG_ENOTFINAL: return "PNG not finalized";
        default: return "unknown error";
    }
}